

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O1

void R_RenderFakeWall(drawseg_t *ds,int x1,int x2,F3DFloor *rover)

{
  side_t *psVar1;
  double dVar2;
  undefined1 auVar3 [16];
  short *psVar4;
  ESPSResult EVar5;
  long lVar6;
  lighttable_t *plVar7;
  int iVar8;
  seg_t **ppsVar9;
  long lVar10;
  float fVar11;
  double yrepeat;
  double dVar12;
  
  auVar3 = SEXT816((long)rover->alpha << 0x10) * ZEXT816(0x8080808080808081);
  EVar5 = R_SetPatchStyle(LegacyRenderStyles[((rover->flags >> 0x1c & 1) != 0) + 6],
                          (int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f),0,0);
  if (EVar5 == DontDraw) goto LAB_0030edda;
  rw_lightstep = ds->lightstep;
  lVar6 = (long)ds->x1;
  fVar11 = (float)(x1 - ds->x1);
  rw_light = rw_lightstep * fVar11 + ds->light;
  mfloorclip = openings + (ds->sprbottomclip - lVar6);
  mceilingclip = openings + (ds->sprtopclip - lVar6);
  spryscale = (double)(fVar11 * ds->iscalestep + ds->iscale);
  rw_scalestep = (double)ds->iscalestep;
  MaskedSWall = (float *)(openings + ds->swall + lVar6 * -2);
  lVar6 = 0x10;
  if ((rover->flags >> 0x11 & 1) == 0) {
    iVar8 = 2;
    ppsVar9 = &curline;
    if ((rover->flags >> 0x12 & 1) == 0) {
      ppsVar9 = (seg_t **)&rover->master;
      iVar8 = 1;
      lVar6 = 0x48;
    }
  }
  else {
    iVar8 = 0;
    ppsVar9 = &curline;
  }
  lVar6 = *(long *)((long)((line_t *)*ppsVar9)->args + lVar6 + -0x2c);
  dVar12 = *(double *)(lVar6 + 0x20 + (ulong)(uint)(iVar8 * 0x30)) * (rw_pic->Scale).X;
  yrepeat = *(double *)(lVar6 + 0x28 + (ulong)(uint)(iVar8 * 0x30)) * (rw_pic->Scale).Y;
  psVar1 = rover->master->sidedef[0];
  dVar2 = psVar1->textures[1].yOffset + curline->sidedef->textures[1].yOffset;
  rw_offset = SUB84(curline->sidedef->textures[1].xOffset + 103079215104.0 +
                    psVar1->textures[1].xOffset,0);
  if (dVar2 < 0.0) {
    dVar2 = dVar2 + (double)rw_pic->Height;
  }
  if ((rw_pic->field_0x31 & 4) != 0) {
    dVar2 = dVar2 * yrepeat;
    rw_offset = SUB84((double)rw_offset * dVar12 + 6755399441055744.0,0);
  }
  dc_texturemid = (rover->model->planes[1].TexZ - ViewPos.Z) * yrepeat + dVar2;
  if ((long)fixedlightlev < 0) {
    plVar7 = fixedcolormap;
    if (fixedcolormap != (lighttable_t *)0x0) goto LAB_0030ec2b;
  }
  else {
    plVar7 = basecolormap->Maps + fixedlightlev;
LAB_0030ec2b:
    dc_colormap = plVar7;
  }
  WallC.sz1 = ds->sz1;
  WallC.sz2 = ds->sz2;
  WallC.sx1 = ds->sx1;
  WallC.sx2 = ds->sx2;
  WallC.tleft.X = ds->cx;
  WallC.tleft.Y = ds->cy;
  WallC.tright.X = WallC.tleft.X + ds->cdx;
  WallC.tright.Y = WallC.tleft.Y + ds->cdy;
  WallT.UoverZorg = (ds->tmapvals).UoverZorg;
  WallT.UoverZstep = (ds->tmapvals).UoverZstep;
  WallT.InvZorg = (ds->tmapvals).InvZorg;
  WallT.InvZstep = (ds->tmapvals).InvZstep;
  OWallMost(wallupper,sclipTop - ViewPos.Z,&WallC);
  OWallMost(walllower,sclipBottom - ViewPos.Z,&WallC);
  psVar4 = mceilingclip;
  lVar6 = (long)x1;
  if (x1 < x2) {
    lVar10 = 0;
    do {
      if (wallupper[lVar10 + lVar6] < psVar4[lVar6 + lVar10]) {
        wallupper[lVar6 + lVar10] = psVar4[lVar6 + lVar10];
      }
      lVar10 = lVar10 + 1;
    } while (x2 - lVar6 != lVar10);
  }
  psVar4 = mfloorclip;
  if (x1 < x2) {
    lVar10 = 0;
    do {
      if (psVar4[lVar6 + lVar10] < walllower[lVar10 + lVar6]) {
        walllower[lVar6 + lVar10] = psVar4[lVar6 + lVar10];
      }
      lVar10 = lVar10 + 1;
    } while (x2 - lVar6 != lVar10);
  }
  PrepLWall(lwall,dVar12 * (double)curline->sidedef->TexelLength,(int)ds->sx1,(int)ds->sx2);
  wallscan_np2_ds(ds,x1,x2,wallupper,walllower,MaskedSWall,lwall,yrepeat);
LAB_0030edda:
  R_FinishSetPatchStyle();
  return;
}

Assistant:

void R_RenderFakeWall(drawseg_t *ds, int x1, int x2, F3DFloor *rover)
{
	int i;
	double xscale;
	double yscale;

	fixed_t Alpha = Scale(rover->alpha, OPAQUE, 255);
	ESPSResult drawmode;
	drawmode = R_SetPatchStyle (LegacyRenderStyles[rover->flags & FF_ADDITIVETRANS ? STYLE_Add : STYLE_Translucent],
		Alpha, 0, 0);

	if(drawmode == DontDraw) {
		R_FinishSetPatchStyle();
		return;
	}

	rw_lightstep = ds->lightstep;
	rw_light = ds->light + (x1 - ds->x1) * rw_lightstep;

	mfloorclip = openings + ds->sprbottomclip - ds->x1;
	mceilingclip = openings + ds->sprtopclip - ds->x1;

	spryscale = ds->iscale + ds->iscalestep * (x1 - ds->x1);
	rw_scalestep = ds->iscalestep;
	MaskedSWall = (float *)(openings + ds->swall) - ds->x1;

	// find positioning
	side_t *scaledside;
	side_t::ETexpart scaledpart;
	if (rover->flags & FF_UPPERTEXTURE)
	{
		scaledside = curline->sidedef;
		scaledpart = side_t::top;
	}
	else if (rover->flags & FF_LOWERTEXTURE)
	{
		scaledside = curline->sidedef;
		scaledpart = side_t::bottom;
	}
	else
	{
		scaledside = rover->master->sidedef[0];
		scaledpart = side_t::mid;
	}
	xscale = rw_pic->Scale.X * scaledside->GetTextureXScale(scaledpart);
	yscale = rw_pic->Scale.Y * scaledside->GetTextureYScale(scaledpart);

	double rowoffset = curline->sidedef->GetTextureYOffset(side_t::mid) + rover->master->sidedef[0]->GetTextureYOffset(side_t::mid);
	double planez = rover->model->GetPlaneTexZ(sector_t::ceiling);
	rw_offset = FLOAT2FIXED(curline->sidedef->GetTextureXOffset(side_t::mid) + rover->master->sidedef[0]->GetTextureXOffset(side_t::mid));
	if (rowoffset < 0)
	{
		rowoffset += rw_pic->GetHeight();
	}
	dc_texturemid = (planez - ViewPos.Z) * yscale;
	if (rw_pic->bWorldPanning)
	{
		// rowoffset is added before the multiply so that the masked texture will
		// still be positioned in world units rather than texels.

		dc_texturemid = dc_texturemid + rowoffset * yscale;
		rw_offset = xs_RoundToInt(rw_offset * xscale);
	}
	else
	{
		// rowoffset is added outside the multiply so that it positions the texture
		// by texels instead of world units.
		dc_texturemid += rowoffset;
	}

	if (fixedlightlev >= 0)
		dc_colormap = basecolormap->Maps + fixedlightlev;
	else if (fixedcolormap != NULL)
		dc_colormap = fixedcolormap;

	WallC.sz1 = ds->sz1;
	WallC.sz2 = ds->sz2;
	WallC.sx1 = ds->sx1;
	WallC.sx2 = ds->sx2;
	WallC.tleft.X = ds->cx;
	WallC.tleft.Y = ds->cy;
	WallC.tright.X = ds->cx + ds->cdx;
	WallC.tright.Y = ds->cy + ds->cdy;
	WallT = ds->tmapvals;

	OWallMost(wallupper, sclipTop - ViewPos.Z, &WallC);
	OWallMost(walllower, sclipBottom - ViewPos.Z, &WallC);

	for (i = x1; i < x2; i++)
	{
		if (wallupper[i] < mceilingclip[i])
			wallupper[i] = mceilingclip[i];
	}
	for (i = x1; i < x2; i++)
	{
		if (walllower[i] > mfloorclip[i])
			walllower[i] = mfloorclip[i];
	}

	PrepLWall (lwall, curline->sidedef->TexelLength*xscale, ds->sx1, ds->sx2);
	wallscan_np2_ds(ds, x1, x2, wallupper, walllower, MaskedSWall, lwall, yscale);
	R_FinishSetPatchStyle();
}